

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_req_make2(httpreq **preq,char *method,size_t m_len,CURLU *url,
                            char *scheme_default)

{
  CURLUcode CVar1;
  char *pcVar2;
  httpreq *local_50;
  CURLcode local_44;
  CURLUcode uc;
  CURLcode result;
  httpreq *req;
  char *scheme_default_local;
  CURLU *url_local;
  size_t m_len_local;
  char *method_local;
  httpreq **preq_local;
  
  local_44 = CURLE_OUT_OF_MEMORY;
  if (0x18 < m_len + 1) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  local_50 = (httpreq *)(*Curl_ccalloc)(1,0xa0);
  if (local_50 != (httpreq *)0x0) {
    memcpy(local_50,method,m_len);
    CVar1 = curl_url_get(url,CURLUPART_SCHEME,&local_50->scheme,0);
    if ((CVar1 == CURLUE_OK) || (CVar1 == CURLUE_NO_SCHEME)) {
      if ((local_50->scheme == (char *)0x0) && (scheme_default != (char *)0x0)) {
        pcVar2 = (*Curl_cstrdup)(scheme_default);
        local_50->scheme = pcVar2;
        if (local_50->scheme == (char *)0x0) goto LAB_00d0c2ae;
      }
      local_44 = req_assign_url_authority(local_50,url);
      if ((local_44 == CURLE_OK) &&
         (local_44 = req_assign_url_path(local_50,url), local_44 == CURLE_OK)) {
        Curl_dynhds_init(&local_50->headers,0,0x100000);
        Curl_dynhds_init(&local_50->trailers,0,0x100000);
        local_44 = CURLE_OK;
      }
    }
  }
LAB_00d0c2ae:
  if ((local_44 != CURLE_OK) && (local_50 != (httpreq *)0x0)) {
    Curl_http_req_free(local_50);
  }
  if (local_44 != CURLE_OK) {
    local_50 = (httpreq *)0x0;
  }
  *preq = local_50;
  return local_44;
}

Assistant:

CURLcode Curl_http_req_make2(struct httpreq **preq,
                             const char *method, size_t m_len,
                             CURLU *url, const char *scheme_default)
{
  struct httpreq *req;
  CURLcode result = CURLE_OUT_OF_MEMORY;
  CURLUcode uc;

  DEBUGASSERT(method);
  if(m_len + 1 > sizeof(req->method))
    return CURLE_BAD_FUNCTION_ARGUMENT;

  req = calloc(1, sizeof(*req));
  if(!req)
    goto out;
  memcpy(req->method, method, m_len);

  uc = curl_url_get(url, CURLUPART_SCHEME, &req->scheme, 0);
  if(uc && uc != CURLUE_NO_SCHEME)
    goto out;
  if(!req->scheme && scheme_default) {
    req->scheme = strdup(scheme_default);
    if(!req->scheme)
      goto out;
  }

  result = req_assign_url_authority(req, url);
  if(result)
    goto out;
  result = req_assign_url_path(req, url);
  if(result)
    goto out;

  Curl_dynhds_init(&req->headers, 0, DYN_HTTP_REQUEST);
  Curl_dynhds_init(&req->trailers, 0, DYN_HTTP_REQUEST);
  result = CURLE_OK;

out:
  if(result && req)
    Curl_http_req_free(req);
  *preq = result? NULL : req;
  return result;
}